

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_init_temp_ext(float temp,float delta,float exponent)

{
  float *ctx;
  llama_sampler *plVar1;
  
  ctx = (float *)operator_new(0xc);
  *ctx = temp;
  ctx[1] = delta;
  ctx[2] = exponent;
  plVar1 = llama_sampler_init(&llama_sampler_temp_ext_i,ctx);
  return plVar1;
}

Assistant:

struct llama_sampler * llama_sampler_init_temp_ext(float temp, float delta, float exponent) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_temp_ext_i,
        /* .ctx   = */ new llama_sampler_temp_ext {
            /* .temp     = */ temp,
            /* .delta    = */ delta,
            /* .exponent = */ exponent,
        }
    );
}